

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBuiltinFunctions.hpp
# Opt level: O0

float rsg::UnaryExponentialFunc<rsg::Exp2Op>::getCompWeight(float outMin,float outMax)

{
  bool bVar1;
  float fVar2;
  float fVar3;
  bool local_35;
  float valRangeLen;
  float intersectionLen;
  float inMax;
  float inMin;
  Scalar local_1c;
  Scalar local_18;
  float local_14;
  float local_10;
  float outMax_local;
  float outMin_local;
  
  local_14 = outMax;
  local_10 = outMin;
  local_18 = Scalar::min<float>();
  Scalar::Scalar((Scalar *)&local_1c.boolVal,local_10);
  bVar1 = Scalar::operator==((Scalar *)&local_18.boolVal,local_1c);
  local_35 = true;
  if (!bVar1) {
    inMin = (float)Scalar::max<float>();
    Scalar::Scalar((Scalar *)&inMax,local_14);
    local_35 = Scalar::operator==((Scalar *)&inMin,(Scalar)inMax);
  }
  if (local_35 == false) {
    bVar1 = Exp2Op::transformValueRange(local_10,local_14,&intersectionLen,&valRangeLen);
    if (bVar1) {
      bVar1 = quantizeFloatRange(&intersectionLen,&valRangeLen);
      if (bVar1) {
        if ((local_10 != local_14) || (NAN(local_10) || NAN(local_14))) {
          fVar2 = Exp2Op::evaluateComp(valRangeLen);
          fVar3 = Exp2Op::evaluateComp(intersectionLen);
          outMax_local = deFloatMax(0.1,(fVar2 - fVar3) / (local_14 - local_10));
        }
        else {
          outMax_local = 1.0;
        }
      }
      else {
        outMax_local = 0.0;
      }
    }
    else {
      outMax_local = 0.0;
    }
  }
  else {
    outMax_local = 1.0;
  }
  return outMax_local;
}

Assistant:

static inline float getCompWeight (float outMin, float outMax)
	{
		if (Scalar::min<float>() == outMin || Scalar::max<float>() == outMax)
			return 1.0f; // Infinite value range, anything goes

		// Transform range
		float inMin, inMax;
		if (!C::transformValueRange(outMin, outMax, inMin, inMax))
			return 0.0f; // Not possible to transform value range (out of range perhaps)

		// Quantize
		if (!quantizeFloatRange(inMin, inMax))
			return 0.0f; // Not possible to quantize - would cause accuracy issues

		if (outMin == outMax)
			return 1.0f; // Constant value and passed quantization

		// Evaluate new intersection
		float intersectionLen	= C::evaluateComp(inMax) - C::evaluateComp(inMin);
		float valRangeLen		= outMax - outMin;

		return deFloatMax(0.1f, intersectionLen/valRangeLen);
	}